

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadAnimatedPerspectiveCamera(XMLLoader *this,Ref<embree::XML> *xml)

{
  __atomic_base<unsigned_long> _Var1;
  long *plVar2;
  string *parmID;
  undefined8 uVar3;
  undefined8 uVar4;
  long *plVar5;
  AnimatedPerspectiveCameraNode *this_00;
  FILE *in_RDX;
  Ref<embree::XML> *xml_00;
  long lVar6;
  size_type __n;
  Vec2f time_range;
  vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
  cameras;
  undefined1 local_90 [8];
  undefined1 local_88 [88];
  
  lVar6 = *(long *)(*(size_t *)in_RDX + 0x88) - *(long *)(*(size_t *)in_RDX + 0x80);
  if (lVar6 == 0) {
    (this->path).filename._M_dataplus._M_p = (pointer)0x0;
  }
  else {
    __n = lVar6 >> 3;
    local_88._32_8_ = in_RDX;
    local_88._56_8_ = this;
    std::
    vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
    ::vector((vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
              *)(local_88 + 0x40),__n,(allocator_type *)local_88);
    lVar6 = 0;
    do {
      xml_00 = *(Ref<embree::XML> **)local_88._32_8_;
      XML::child((XML *)local_90,(size_t)xml_00);
      loadPerspectiveCamera((XMLLoader *)local_88,xml_00);
      uVar3 = local_88._0_8_;
      if (local_88._0_8_ == 0) {
        plVar5 = (long *)0x0;
      }
      else {
        plVar5 = (long *)__dynamic_cast(local_88._0_8_,&SceneGraph::Node::typeinfo,
                                        &SceneGraph::PerspectiveCameraNode::typeinfo,0);
      }
      if (plVar5 != (long *)0x0) {
        (**(code **)(*plVar5 + 0x10))(plVar5);
      }
      uVar4 = local_88._64_8_;
      plVar2 = *(long **)(local_88._64_8_ + lVar6 * 8);
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 0x18))();
      }
      *(long **)(uVar4 + lVar6 * 8) = plVar5;
      if (uVar3 != 0) {
        (**(code **)(*(long *)uVar3 + 0x18))(uVar3);
      }
      if ((BBox1f)local_90 != (BBox1f)0x0) {
        (**(code **)(*(long *)local_90 + 0x18))();
      }
      lVar6 = lVar6 + 1;
    } while (__n + (__n == 0) != lVar6);
    parmID = *(string **)local_88._32_8_;
    _Var1._M_i = (long)local_88 + 0x10;
    local_88._0_8_ = _Var1._M_i;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"time_range","");
    XML::parm_Vec2f((XML *)local_90,parmID);
    this = (XMLLoader *)local_88._56_8_;
    if (local_88._0_8_ != _Var1._M_i) {
      operator_delete((void *)local_88._0_8_);
    }
    this_00 = (AnimatedPerspectiveCameraNode *)alignedMalloc(0xd0,0x10);
    local_88._32_8_ = local_90;
    local_88._40_8_ = (pointer)0x0;
    local_88._0_8_ = _Var1._M_i;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"");
    SceneGraph::AnimatedPerspectiveCameraNode::AnimatedPerspectiveCameraNode
              (this_00,(vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                        *)(local_88 + 0x40),(BBox1f)local_88._32_8_,(string *)local_88);
    *(AnimatedPerspectiveCameraNode **)this = this_00;
    (*(this_00->super_PerspectiveCameraNode).super_Node.super_RefCount._vptr_RefCount[2])(this_00);
    if (local_88._0_8_ != _Var1._M_i) {
      operator_delete((void *)local_88._0_8_);
    }
    std::
    vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
    ::~vector((vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
               *)(local_88 + 0x40));
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadAnimatedPerspectiveCamera(const Ref<XML>& xml) 
  {
    size_t numCameras = xml->size();
    if (numCameras == 0)
      return nullptr;
    
    std::vector<Ref<SceneGraph::PerspectiveCameraNode>> cameras(numCameras);
    
    for (size_t i=0; i<numCameras; i++) 
      cameras[i] = loadPerspectiveCamera(xml->child(i)).dynamicCast<SceneGraph::PerspectiveCameraNode>();

    const Vec2f time_range = xml->parm_Vec2f("time_range");
    return new SceneGraph::AnimatedPerspectiveCameraNode(std::move(cameras),BBox1f(time_range.x,time_range.y));
  }